

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

void av1_generate_block_2x2_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,
               uint32_t **pic_block_hash,int8_t **pic_block_same_info)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  uint8_t *puVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint8_t p [4];
  uint16_t p_1 [4];
  uint8_t local_70 [4];
  short local_6c [4];
  uint local_64;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  CRC_CALCULATOR *local_40;
  CRC_CALCULATOR *local_38;
  
  uVar2 = (picture->field_2).field_0.y_crop_width;
  uVar8 = (ulong)uVar2;
  iVar11 = (picture->field_3).field_0.y_crop_height;
  uVar2 = uVar2 - 1;
  local_64 = iVar11 - 1;
  local_40 = &intrabc_hash_info->crc_calculator1;
  local_38 = &intrabc_hash_info->crc_calculator2;
  local_48 = uVar8;
  if ((picture->flags & 8) == 0) {
    if (1 < iVar11) {
      local_58 = (ulong)uVar2;
      local_60 = 0;
      uVar14 = 0;
      uVar2 = local_64;
      do {
        if (1 < (int)uVar8) {
          uVar14 = (ulong)(int)uVar14;
          local_50 = (long)(int)local_60;
          uVar9 = 0;
          do {
            lVar5 = (long)(picture->field_4).field_0.y_stride;
            puVar6 = (picture->field_5).buffers[0] + uVar9 + lVar5 * local_50;
            lVar10 = 0;
            bVar1 = true;
            do {
              bVar7 = bVar1;
              lVar10 = (long)(int)lVar10;
              iVar11 = 2;
              lVar12 = 0;
              do {
                local_70[lVar10] = puVar6[lVar12];
                lVar10 = lVar10 + 1;
                lVar12 = 1;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
              puVar6 = puVar6 + lVar5;
              bVar1 = false;
            } while (bVar7);
            (*pic_block_same_info)[uVar14] =
                 local_70[3] == local_70[2] && local_70[0] == local_70[1];
            pic_block_same_info[1][uVar14] =
                 local_70[3] == local_70[1] && local_70[0] == local_70[2];
            uVar3 = av1_get_crc_value(local_40,local_70,4);
            (*pic_block_hash)[uVar14] = uVar3;
            uVar3 = av1_get_crc_value(local_38,local_70,4);
            pic_block_hash[1][uVar14] = uVar3;
            uVar14 = uVar14 + 1;
            uVar9 = uVar9 + 1;
            uVar8 = local_48;
            uVar2 = local_64;
          } while (uVar9 != local_58);
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        uVar4 = (int)local_60 + 1;
        local_60 = (ulong)uVar4;
      } while (uVar4 != uVar2);
    }
  }
  else if (1 < iVar11) {
    local_58 = (ulong)uVar2;
    local_60 = 0;
    uVar14 = 0;
    uVar2 = local_64;
    do {
      if (1 < (int)uVar8) {
        uVar14 = (ulong)(int)uVar14;
        local_50 = (long)(int)local_60;
        uVar9 = 0;
        do {
          lVar10 = (long)(picture->field_4).field_0.y_stride;
          lVar5 = lVar10 * local_50 * 2 + (long)(picture->field_5).field_0.y_buffer * 2 + uVar9 * 2;
          lVar12 = 0;
          bVar1 = true;
          do {
            bVar7 = bVar1;
            lVar12 = (long)(int)lVar12;
            iVar11 = 2;
            lVar13 = 0;
            do {
              local_6c[lVar12] = *(short *)(lVar5 + lVar13 * 2);
              lVar12 = lVar12 + 1;
              lVar13 = 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
            lVar5 = lVar5 + lVar10 * 2;
            bVar1 = false;
          } while (bVar7);
          (*pic_block_same_info)[uVar14] = local_6c[3] == local_6c[2] && local_6c[0] == local_6c[1];
          pic_block_same_info[1][uVar14] = local_6c[3] == local_6c[1] && local_6c[0] == local_6c[2];
          uVar3 = av1_get_crc_value(local_40,(uint8_t *)local_6c,8);
          (*pic_block_hash)[uVar14] = uVar3;
          uVar3 = av1_get_crc_value(local_38,(uint8_t *)local_6c,8);
          pic_block_hash[1][uVar14] = uVar3;
          uVar14 = uVar14 + 1;
          uVar9 = uVar9 + 1;
          uVar8 = local_48;
          uVar2 = local_64;
        } while (uVar9 != local_58);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      uVar4 = (int)local_60 + 1;
      local_60 = (ulong)uVar4;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void av1_generate_block_2x2_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                       const YV12_BUFFER_CONFIG *picture,
                                       uint32_t *pic_block_hash[2],
                                       int8_t *pic_block_same_info[3]) {
  const int width = 2;
  const int height = 2;
  const int x_end = picture->y_crop_width - width + 1;
  const int y_end = picture->y_crop_height - height + 1;
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int length = width * 2;
  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    uint16_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_short_array_by_block_2x2(
            CONVERT_TO_SHORTPTR(picture->y_buffer) + y_pos * picture->y_stride +
                x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block16_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block16_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, (uint8_t *)p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, (uint8_t *)p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  } else {
    uint8_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_char_array_by_block_2x2(
            picture->y_buffer + y_pos * picture->y_stride + x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  }
}